

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

int32 mkvmuxer::GetUIntSize(uint64 value)

{
  int iVar1;
  
  iVar1 = 1;
  if ((((0xff < value) && (iVar1 = 2, 0xffff < value)) && (iVar1 = 3, 0xffffff < value)) &&
     (((iVar1 = 4, value >> 0x20 != 0 && (iVar1 = 5, value >> 0x28 != 0)) &&
      (iVar1 = 6, value >> 0x30 != 0)))) {
    iVar1 = 8 - (uint)(value >> 0x38 == 0);
  }
  return iVar1;
}

Assistant:

int32 GetUIntSize(uint64 value) {
  if (value < 0x0000000000000100ULL)
    return 1;
  else if (value < 0x0000000000010000ULL)
    return 2;
  else if (value < 0x0000000001000000ULL)
    return 3;
  else if (value < 0x0000000100000000ULL)
    return 4;
  else if (value < 0x0000010000000000ULL)
    return 5;
  else if (value < 0x0001000000000000ULL)
    return 6;
  else if (value < 0x0100000000000000ULL)
    return 7;
  return 8;
}